

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O1

void __thiscall urllib::Request::parseUrl(Request *this)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  bool bVar7;
  string tmp;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  psVar1 = &this->url_;
  lVar4 = std::__cxx11::string::find((char *)psVar1,0x10702f,0);
  if (lVar4 == -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
    pcVar5 = ": is not a valid URL.";
  }
  else {
    if ((this->url_)._M_string_length < 0x5dd) {
      iVar3 = std::__cxx11::string::compare((ulong)psVar1,0,(char *)0x7);
      if (iVar3 == 0) {
        bVar7 = true;
      }
      else {
        bVar7 = false;
        iVar3 = std::__cxx11::string::compare((ulong)psVar1,0,(char *)0x8);
        if (iVar3 != 0) {
          poVar6 = (ostream *)&std::cout;
          pcVar5 = "Only HTTP/HTTPS protocol is directly supported.";
          goto LAB_0010490c;
        }
      }
      this->isHTTP_ = bVar7;
      local_40 = 0;
      local_38[0] = 0;
      local_48 = local_38;
      if (bVar7 == false) {
        pcVar2 = (this->url_)._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_68,pcVar2 + 8,pcVar2 + (this->url_)._M_string_length);
      }
      else {
        pcVar2 = (this->url_)._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_68,pcVar2 + 7,pcVar2 + (this->url_)._M_string_length);
      }
      std::__cxx11::string::operator=((string *)&local_48,(string *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      lVar4 = std::__cxx11::string::find((char *)&local_48,0x107031,0);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&this->host_);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->uri_,0,(char *)(this->uri_)._M_string_length,0x107031);
      }
      else {
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_68,local_48,local_48 + lVar4);
        std::__cxx11::string::operator=((string *)&this->host_,(string *)local_68);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_68,local_48 + lVar4,local_48 + local_40);
        std::__cxx11::string::operator=((string *)&this->uri_,(string *)local_68);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
      }
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
      return;
    }
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "url is too long.";
  }
LAB_0010490c:
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(2);
}

Assistant:

void Request::parseUrl()
{
    if (url_.find("://") == string::npos)
    {
        cout << url_ << ": is not a valid URL." << endl;
        exit(2);
    }

    if (url_.size() > 1500)
    {
        cout << "url is too long." << endl;
        exit(2);
    }

    if (url_.compare(0, 7, "http://") == 0)
    {
        isHTTP_ = true;    
    }
    else if (url_.compare(0, 8, "https://") == 0)
    {
        isHTTP_ = false;
    }
    else
    {
        cout << "Only HTTP/HTTPS protocol is directly supported." << endl;
        exit(2);
    }

    string tmp;

    if (isHTTP_)
        tmp = string(url_.begin()+7, url_.end());   // remove "http://"
    else
        tmp = string(url_.begin()+8, url_.end());   // remove "https://"

    auto pos = tmp.find("/");
    if (pos == string::npos)
    {
        host_ = tmp;
        uri_ = "/";
    }
    else
    {
        host_ = string(tmp.begin(), tmp.begin()+pos);
        uri_ = string(tmp.begin()+pos, tmp.end());
    }
}